

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O2

void duckdb_fast_float::detail::decimal_right_shift(decimal *h,uint32_t shift)

{
  uint8_t *puVar1;
  byte bVar2;
  ulong uVar3;
  uint8_t uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  bVar2 = (byte)shift;
  uVar8 = h->num_digits;
  uVar5 = (ulong)uVar8;
  uVar7 = 0;
  uVar3 = 0;
  do {
    if (uVar3 >> (bVar2 & 0x3f) != 0) {
      uVar8 = (uint)uVar7;
LAB_016590df:
      iVar6 = (h->decimal_point - uVar8) + 1;
      h->decimal_point = iVar6;
      if (iVar6 < -0x7ff) {
        h->negative = false;
        h->truncated = false;
        h->num_digits = 0;
        h->decimal_point = 0;
        return;
      }
      uVar7 = ~(-1L << (bVar2 & 0x3f));
      uVar9 = 0;
      for (uVar10 = (ulong)uVar8; uVar10 < uVar5; uVar10 = uVar10 + 1) {
        uVar11 = uVar3 >> (bVar2 & 0x3f);
        uVar3 = (ulong)h->digits[uVar10] + (uVar3 & uVar7) * 10;
        h->digits[uVar9] = (uint8_t)uVar11;
        uVar9 = uVar9 + 1;
      }
      while (uVar8 = (uint)uVar9, uVar3 != 0) {
        uVar5 = uVar3 >> (bVar2 & 0x3f);
        uVar3 = (uVar3 & uVar7) * 10;
        uVar4 = (uint8_t)uVar5;
        if (uVar8 < 0x300) {
          uVar5 = uVar9 & 0xffffffff;
          uVar9 = (ulong)(uVar8 + 1);
          h->digits[uVar5] = uVar4;
        }
        else if (uVar4 != '\0') {
          h->truncated = true;
        }
      }
      h->num_digits = uVar8;
      trim(h);
      return;
    }
    if (uVar5 == uVar7) {
      if (uVar3 == 0) {
        return;
      }
      for (; uVar3 >> (bVar2 & 0x3f) == 0; uVar3 = uVar3 * 10) {
        uVar8 = uVar8 + 1;
      }
      goto LAB_016590df;
    }
    puVar1 = h->digits + uVar7;
    uVar7 = uVar7 + 1;
    uVar3 = (ulong)*puVar1 + uVar3 * 10;
  } while( true );
}

Assistant:

inline void decimal_right_shift(decimal &h, uint32_t shift) {
  uint32_t read_index = 0;
  uint32_t write_index = 0;

  uint64_t n = 0;

  while ((n >> shift) == 0) {
    if (read_index < h.num_digits) {
      n = (10 * n) + h.digits[read_index++];
    } else if (n == 0) {
      return;
    } else {
      while ((n >> shift) == 0) {
        n = 10 * n;
        read_index++;
      }
      break;
    }
  }
  h.decimal_point -= int32_t(read_index - 1);
  if (h.decimal_point < -decimal_point_range) { // it is zero
    h.num_digits = 0;
    h.decimal_point = 0;
    h.negative = false;
    h.truncated = false;
    return;
  }
  uint64_t mask = (uint64_t(1) << shift) - 1;
  while (read_index < h.num_digits) {
    uint8_t new_digit = uint8_t(n >> shift);
    n = (10 * (n & mask)) + h.digits[read_index++];
    h.digits[write_index++] = new_digit;
  }
  while (n > 0) {
    uint8_t new_digit = uint8_t(n >> shift);
    n = 10 * (n & mask);
    if (write_index < max_digits) {
      h.digits[write_index++] = new_digit;
    } else if (new_digit > 0) {
      h.truncated = true;
    }
  }
  h.num_digits = write_index;
  trim(h);
}